

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O3

void AM_LevelInit(void)

{
  double dVar1;
  char *pcVar2;
  vertex_t *pvVar3;
  long lVar4;
  long lVar5;
  char *name;
  double *pdVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  
  pcVar2 = ((level.info)->MapBackground).Chars;
  name = "AUTOPAGE";
  if (*(int *)(pcVar2 + -0xc) != 0) {
    name = pcVar2;
  }
  mapback = FTextureManager::CheckForTexture(&TexMan,name,8,1);
  lVar4 = 0xa0;
  do {
    *(undefined8 *)((long)&scale_ftom + lVar4) = 0xbff0000000000000;
    pvVar3 = vertexes;
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != 0);
  markpointnum = 0;
  min_y = 3.4028234663852886e+38;
  min_x = 3.4028234663852886e+38;
  max_y = -2147483648.0;
  max_x = -2147483648.0;
  lVar4 = (long)numvertexes;
  auVar13 = _DAT_005e6b80;
  if (0 < lVar4) {
    dVar9 = -2147483648.0;
    dVar11 = 3.4028234663852886e+38;
    lVar5 = 0;
    dVar10 = 3.4028234663852886e+38;
    dVar8 = -2147483648.0;
    do {
      dVar1 = *(double *)((long)&(pvVar3->p).X + lVar5);
      if (dVar11 <= dVar1) {
        pdVar6 = &max_x;
        dVar14 = dVar1;
        if (dVar9 < dVar1) goto LAB_003472fa;
      }
      else {
        pdVar6 = &min_x;
        dVar14 = dVar9;
        dVar11 = dVar1;
LAB_003472fa:
        *pdVar6 = dVar1;
        dVar9 = dVar14;
      }
      dVar1 = *(double *)((long)&(pvVar3->p).Y + lVar5);
      if (dVar10 <= dVar1) {
        pdVar6 = &max_y;
        dVar14 = dVar1;
        if (dVar8 < dVar1) goto LAB_00347329;
      }
      else {
        pdVar6 = &min_y;
        dVar10 = dVar1;
        dVar14 = dVar8;
LAB_00347329:
        dVar8 = dVar14;
        *pdVar6 = dVar1;
      }
      lVar5 = lVar5 + 0x10;
    } while (lVar4 * 0x10 != lVar5);
    auVar13._0_8_ = dVar9 - dVar11;
    auVar13._8_8_ = dVar8 - dVar10;
  }
  max_w = auVar13._0_8_;
  max_h = auVar13._8_8_;
  auVar12._0_8_ = (double)(screen->super_DSimpleCanvas).super_DCanvas.Width;
  auVar12._8_8_ = (double)ST_Y;
  auVar13 = divpd(auVar12,auVar13);
  min_scale_mtof = auVar13._0_8_;
  if (auVar13._8_8_ <= auVar13._0_8_) {
    min_scale_mtof = auVar13._8_8_;
  }
  max_scale_mtof = (double)(screen->super_DSimpleCanvas).super_DCanvas.Height * 0.03125;
  uVar7 = -(ulong)(max_scale_mtof < min_scale_mtof / 0.7);
  scale_mtof = (double)(~uVar7 & (ulong)(min_scale_mtof / 0.7) | (ulong)min_scale_mtof & uVar7);
  scale_ftom = 1.0 / scale_mtof;
  if (am_showalllines.super_FBaseCVar.m_Callback == (_func_void_FBaseCVar_ptr *)0x0) {
    return;
  }
  (*am_showalllines.super_FBaseCVar.m_Callback)(&am_showalllines.super_FBaseCVar);
  return;
}

Assistant:

void AM_LevelInit ()
{
	if (level.info->MapBackground.Len() == 0)
	{
		mapback = TexMan.CheckForTexture("AUTOPAGE", FTexture::TEX_MiscPatch);
	}
	else
	{
		mapback = TexMan.CheckForTexture(level.info->MapBackground, FTexture::TEX_MiscPatch);
	}

	AM_clearMarks();

	AM_findMinMaxBoundaries();
	scale_mtof = min_scale_mtof / 0.7;
	if (scale_mtof > max_scale_mtof)
		scale_mtof = min_scale_mtof;
	scale_ftom = 1 / scale_mtof;

	am_showalllines.Callback();
}